

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_select.cpp
# Opt level: O3

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformSelectNodeInternal
          (Transformer *this,PGSelectStmt *select,bool is_select)

{
  ParserException *pPVar1;
  int in_ECX;
  undefined7 in_register_00000011;
  long lVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_48;
  undefined1 local_40 [32];
  
  lVar2 = CONCAT71(in_register_00000011,is_select);
  if (in_ECX != 0) {
    if (*(long *)(lVar2 + 0x10) != 0) {
      pPVar1 = (ParserException *)__cxa_allocate_exception(0x10);
      local_40._0_8_ = local_40 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"SELECT INTO not supported!","");
      ParserException::ParserException(pPVar1,(string *)local_40);
      __cxa_throw(pPVar1,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(long *)(lVar2 + 0x80) != 0) {
      pPVar1 = (ParserException *)__cxa_allocate_exception(0x10);
      local_40._0_8_ = local_40 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"SELECT locking clause is not supported!","");
      ParserException::ParserException(pPVar1,(string *)local_40);
      __cxa_throw(pPVar1,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if (*(long *)(lVar2 + 0x58) == 0) {
    TransformSelectInternal((Transformer *)local_40,select);
  }
  else {
    TransformPivotStatement((Transformer *)local_40,select);
  }
  local_48._M_head_impl = (QueryNode *)local_40._0_8_;
  TransformMaterializedCTE
            (this,(unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                  &local_48);
  if (local_48._M_head_impl != (QueryNode *)0x0) {
    (*(local_48._M_head_impl)->_vptr_QueryNode[1])();
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformSelectNodeInternal(duckdb_libpgquery::PGSelectStmt &select,
                                                               bool is_select) {
	// Both Insert/Create Table As uses this.
	if (is_select) {
		if (select.intoClause) {
			throw ParserException("SELECT INTO not supported!");
		}
		if (select.lockingClause) {
			throw ParserException("SELECT locking clause is not supported!");
		}
	}
	unique_ptr<QueryNode> stmt = nullptr;
	if (select.pivot) {
		stmt = TransformPivotStatement(select);
	} else {
		stmt = TransformSelectInternal(select);
	}
	return TransformMaterializedCTE(std::move(stmt));
}